

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::RunContext::testGroupEnded
          (RunContext *this,string *testSpec,Totals *totals,size_t groupIndex,size_t groupsCount)

{
  IStreamingReporter *pIVar1;
  int iVar2;
  TestGroupStats local_d8;
  GroupInfo local_68;
  Totals *local_38;
  
  pIVar1 = (this->m_reporter).m_p;
  local_38 = totals;
  std::__cxx11::string::string((string *)&local_68,(string *)testSpec);
  local_68.groupIndex = groupIndex;
  local_68.groupsCounts = groupsCount;
  iVar2 = (*(this->super_IResultCapture)._vptr_IResultCapture[0xb])(this);
  TestGroupStats::TestGroupStats(&local_d8,&local_68,local_38,SUB41(iVar2,0));
  (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[0xe])(pIVar1,&local_d8);
  TestGroupStats::~TestGroupStats(&local_d8);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void testGroupEnded( std::string const& testSpec, Totals const& totals, std::size_t groupIndex, std::size_t groupsCount ) {
            m_reporter->testGroupEnded( TestGroupStats( GroupInfo( testSpec, groupIndex, groupsCount ), totals, aborting() ) );
        }